

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O1

float fe_warp_warped_to_unwarped(melfb_t *mel,float nonlinear)

{
  switch(mel->warp_id) {
  case 0:
    if ((is_neutral == '\x01') && (nonlinear = nonlinear * params[0], nyquist_frequency < nonlinear)
       ) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_inverse_linear.c"
              ,0x97,"Warp factor %g results in frequency (%.1f) higher than Nyquist (%.1f)\n",
              (double)params[0],(double)nonlinear,(double)nyquist_frequency);
    }
    break;
  case 1:
    if ((is_neutral == '\x01') &&
       (nonlinear = (nonlinear - params[1]) / params[0], nyquist_frequency < nonlinear)) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_affine.c"
              ,0x98,"Warp factor %g results in frequency (%.1f) higher than Nyquist (%.1f)\n",
              (double)params[0],(double)nonlinear,(double)nyquist_frequency);
    }
    return nonlinear;
  case 2:
    if (is_neutral == '\x01') {
      if (params[1] * params[0] <= nonlinear) {
        nonlinear = (nonlinear - final_piece[1]) / final_piece[0];
      }
      else {
        nonlinear = nonlinear / params[0];
      }
      if (nyquist_frequency < nonlinear) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_piecewise_linear.c"
                ,0xbe,"Warp factor %g results in frequency (%.1f) higher than Nyquist (%.1f)\n",
                (double)params[0],(double)nonlinear,(double)nyquist_frequency);
      }
    }
    return nonlinear;
  default:
    if (mel->warp_id == 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
              ,0xd1,"fe_warp module must be configured w/ a valid ID\n");
    }
    else {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
              ,0xd6,"fe_warp module misconfigured with invalid fe_warp_id %u\n");
    }
    exit(1);
  }
  return nonlinear;
}

Assistant:

float
fe_warp_warped_to_unwarped(melfb_t *mel, float nonlinear)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        return fe_warp_conf[mel->warp_id].warped_to_unwarped(nonlinear);
    }
    else if (mel->warp_id == FE_WARP_ID_NONE) {
        E_FATAL("fe_warp module must be configured w/ a valid ID\n");
    }
    else {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }

    return 0;
}